

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_iwmmxt_andq_M0_wRn(TCGContext_conflict1 *tcg_ctx,int rn)

{
  int rn_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  iwmmxt_load_reg(tcg_ctx,tcg_ctx->cpu_V1,rn);
  tcg_gen_and_i64_aarch64(tcg_ctx,tcg_ctx->cpu_M0,tcg_ctx->cpu_M0,tcg_ctx->cpu_V1);
  return;
}

Assistant:

static inline void gen_op_iwmmxt_andq_M0_wRn(TCGContext *tcg_ctx, int rn)
{
    iwmmxt_load_reg(tcg_ctx, tcg_ctx->cpu_V1, rn);
    tcg_gen_and_i64(tcg_ctx, tcg_ctx->cpu_M0, tcg_ctx->cpu_M0, tcg_ctx->cpu_V1);
}